

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O0

void UnlockDirectory(path *directory,path *lockfile_name)

{
  long lVar1;
  undefined8 in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  key_type *in_stack_ffffffffffffff50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>_>_>_>
  *in_stack_ffffffffffffff58;
  path *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff78;
  GlobalMutex *in_stack_ffffffffffffff80;
  UniqueLock<GlobalMutex> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<GlobalMutex>((GlobalMutex *)in_stack_ffffffffffffff48);
  UniqueLock<GlobalMutex>::UniqueLock
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RDI,
             (int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  fs::path::path((path *)in_stack_ffffffffffffff48,(path *)0x1ab96c5);
  fs::operator/(in_stack_ffffffffffffff60,(path *)in_stack_ffffffffffffff58);
  fs::PathToString_abi_cxx11_((path *)in_stack_ffffffffffffff50);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>_>_>_>
  ::erase(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  fs::path::~path((path *)in_stack_ffffffffffffff48);
  fs::path::~path((path *)in_stack_ffffffffffffff48);
  UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnlockDirectory(const fs::path& directory, const fs::path& lockfile_name)
{
    LOCK(cs_dir_locks);
    dir_locks.erase(fs::PathToString(directory / lockfile_name));
}